

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

void tokendif(tokcxdef *ctx,char *p,int len)

{
  undefined4 in_EDX;
  errcxdef *in_RSI;
  tokcxdef *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_RDI->tokcxifcnt == 0) {
    errlogf(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
  }
  else {
    in_RDI->tokcxifcnt = in_RDI->tokcxifcnt + -1;
    tok_update_if_stat(in_RDI);
  }
  return;
}

Assistant:

static void tokendif(tokcxdef *ctx, char *p, int len)
{
    /* if we're not expecting #endif, it's an error */
    if (ctx->tokcxifcnt == 0)
    {
        errlog(ctx->tokcxerr, ERR_BADENDIF);
        return;
    }

    /* remove the #if level */
    ctx->tokcxifcnt--;

    /* update the current status */
    tok_update_if_stat(ctx);
}